

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_utils.cpp
# Opt level: O0

CMutableTransaction * BuildCreditingTransaction(CScript *scriptPubKey,int nValue)

{
  long lVar1;
  reference pvVar2;
  vector<CTxOut,_std::allocator<CTxOut>_> *this;
  reference pvVar3;
  int in_EDX;
  CMutableTransaction *in_RDI;
  long in_FS_OFFSET;
  CMutableTransaction *txCredit;
  CMutableTransaction *in_stack_ffffffffffffff48;
  CScript *in_stack_ffffffffffffff50;
  CScript *in_stack_ffffffffffffff58;
  size_type in_stack_ffffffffffffff60;
  vector<CTxIn,_std::allocator<CTxIn>_> *in_stack_ffffffffffffff68;
  CScript *in_stack_ffffffffffffff70;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(in_stack_ffffffffffffff48);
  in_RDI->version = 1;
  in_RDI->nLockTime = 0;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffff68,
             in_stack_ffffffffffffff60);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffff58,
             (size_type)in_stack_ffffffffffffff50);
  COutPoint::SetNull((COutPoint *)in_stack_ffffffffffffff48);
  CScript::CScript((CScript *)in_stack_ffffffffffffff48);
  CScriptNum::CScriptNum((CScriptNum *)in_stack_ffffffffffffff48,(int64_t *)0xebe7ae);
  CScript::operator<<(in_stack_ffffffffffffff70,(CScriptNum *)in_stack_ffffffffffffff68);
  CScriptNum::CScriptNum((CScriptNum *)in_stack_ffffffffffffff48,(int64_t *)0xebe7e4);
  CScript::operator<<(in_stack_ffffffffffffff70,(CScriptNum *)in_stack_ffffffffffffff68);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffff58,
             (size_type)in_stack_ffffffffffffff50);
  CScript::operator=(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  CScript::~CScript((CScript *)in_stack_ffffffffffffff48);
  pvVar2 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffff58,
                      (size_type)in_stack_ffffffffffffff50);
  pvVar2->nSequence = 0xffffffff;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffff58,
             (size_type)in_stack_ffffffffffffff50);
  CScript::operator=(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  this = (vector<CTxOut,_std::allocator<CTxOut>_> *)(long)in_EDX;
  pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     (this,(size_type)in_stack_ffffffffffffff50);
  pvVar3->nValue = (CAmount)this;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

CMutableTransaction BuildCreditingTransaction(const CScript& scriptPubKey, int nValue)
{
    CMutableTransaction txCredit;
    txCredit.version = 1;
    txCredit.nLockTime = 0;
    txCredit.vin.resize(1);
    txCredit.vout.resize(1);
    txCredit.vin[0].prevout.SetNull();
    txCredit.vin[0].scriptSig = CScript() << CScriptNum(0) << CScriptNum(0);
    txCredit.vin[0].nSequence = CTxIn::SEQUENCE_FINAL;
    txCredit.vout[0].scriptPubKey = scriptPubKey;
    txCredit.vout[0].nValue = nValue;

    return txCredit;
}